

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_24_3_f49331b9 * __thiscall
qclab::qgates::lambda_RotationZ<std::complex<float>,float>
          (anon_class_24_3_f49331b9 *__return_storage_ptr__,qgates *this,Op op,float cos,float sin,
          complex<float> *vector)

{
  undefined7 in_register_00000011;
  anon_class_24_3_f49331b9 f;
  complex<float> lambda2;
  complex<float> lambda1;
  complex<float> *vector_local;
  float sin_local;
  float cos_local;
  Op op_local;
  
  std::complex<float>::complex(&lambda2,cos,-sin);
  std::complex<float>::complex(&f.lambda2,cos,sin);
  if ((char)this == 'C') {
    std::swap<std::complex<float>>(&lambda2,&f.lambda2);
  }
  __return_storage_ptr__->vector = (complex<float> *)CONCAT71(in_register_00000011,op);
  (__return_storage_ptr__->lambda1)._M_value = lambda2._M_value;
  (__return_storage_ptr__->lambda2)._M_value = f.lambda2._M_value;
  return __return_storage_ptr__;
}

Assistant:

auto lambda_RotationZ( Op op , const R cos , const R sin , T* vector ) {
    // operation
    T lambda1 = T( cos , -sin ) ;
    T lambda2 = T( cos ,  sin ) ;
    if ( op == Op::ConjTrans ) std::swap( lambda1 , lambda2 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      vector[a] *= lambda1 ;
      vector[b] *= lambda2 ;
    } ;
    return f ;
  }